

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

int NULLCString::strcmp(char *__s1,char *__s2)

{
  int iVar1;
  int in_ECX;
  char *in_RDX;
  char *error;
  
  if (__s1 == (char *)0x0) {
    error = "first string is null";
  }
  else if (in_RDX == (char *)0x0) {
    error = "second string is null";
  }
  else if (((int)__s2 == 0) || (__s1[(int)__s2 - 1] != '\0')) {
    error = "first string is not null-terminated";
  }
  else {
    if ((in_ECX != 0) && (in_RDX[in_ECX - 1] == '\0')) {
      iVar1 = ::strcmp(__s1,in_RDX);
      if (iVar1 < 0) {
        return -1;
      }
      return (uint)(iVar1 != 0);
    }
    error = "second string is not null-terminated";
  }
  nullcThrowError(error);
  return -1;
}

Assistant:

int strcmp(NULLCArray a, NULLCArray b)
	{
		if(!a.ptr)
		{
			nullcThrowError("first string is null");
			return -1;
		}

		if(!b.ptr)
		{
			nullcThrowError("second string is null");
			return -1;
		}

		if(a.len == 0 || a.ptr[a.len - 1])
		{
			nullcThrowError("first string is not null-terminated");
			return -1;
		}

		if(b.len == 0 || b.ptr[b.len - 1])
		{
			nullcThrowError("second string is not null-terminated");
			return -1;
		}

		int result = ::strcmp(a.ptr, b.ptr);

		return result < 0 ? -1 : result == 0 ? 0 : 1;
	}